

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UBool __thiscall icu_63::UnicodeSet::containsAll(UnicodeSet *this,UnicodeSet *c)

{
  UBool UVar1;
  int32_t iVar2;
  UChar32 start;
  UChar32 end;
  int local_28;
  int i;
  int32_t n;
  UnicodeSet *c_local;
  UnicodeSet *this_local;
  
  iVar2 = getRangeCount(c);
  local_28 = 0;
  while( true ) {
    if (iVar2 <= local_28) {
      UVar1 = UVector::containsAll(this->strings,c->strings);
      return UVar1 != '\0';
    }
    start = getRangeStart(c,local_28);
    end = getRangeEnd(c,local_28);
    UVar1 = contains(this,start,end);
    if (UVar1 == '\0') break;
    local_28 = local_28 + 1;
  }
  return '\0';
}

Assistant:

UBool UnicodeSet::containsAll(const UnicodeSet& c) const {
    // The specified set is a subset if all of its pairs are contained in
    // this set.  It's possible to code this more efficiently in terms of
    // direct manipulation of the inversion lists if the need arises.
    int32_t n = c.getRangeCount();
    for (int i=0; i<n; ++i) {
        if (!contains(c.getRangeStart(i), c.getRangeEnd(i))) {
            return FALSE;
        }
    }
    if (!strings->containsAll(*c.strings)) return FALSE;
    return TRUE;
}